

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O0

JavascriptPromiseCapability *
TTD::NSSnapValues::InflatePromiseCapabilityInfo
          (SnapPromiseCapabilityInfo *capabilityInfo,ScriptContext *ctx,InflateMap *inflator)

{
  bool bVar1;
  Var promise_00;
  Var resolve_00;
  Var reject_00;
  JavascriptLibrary *this;
  JavascriptPromiseCapability *pJVar2;
  JavascriptPromiseCapability *res;
  Var reject;
  Var resolve;
  Var promise;
  InflateMap *inflator_local;
  ScriptContext *ctx_local;
  SnapPromiseCapabilityInfo *capabilityInfo_local;
  
  bVar1 = InflateMap::IsPromiseInfoDefined<Js::JavascriptPromiseCapability>
                    (inflator,capabilityInfo->CapabilityId);
  if (!bVar1) {
    promise_00 = InflateMap::InflateTTDVar(inflator,capabilityInfo->PromiseVar);
    resolve_00 = InflateMap::InflateTTDVar(inflator,capabilityInfo->ResolveVar);
    reject_00 = InflateMap::InflateTTDVar(inflator,capabilityInfo->RejectVar);
    this = Js::ScriptContext::GetLibrary(ctx);
    pJVar2 = Js::JavascriptLibrary::CreatePromiseCapability_TTD
                       (this,promise_00,resolve_00,reject_00);
    InflateMap::AddInflatedPromiseInfo<Js::JavascriptPromiseCapability>
              (inflator,capabilityInfo->CapabilityId,pJVar2);
  }
  pJVar2 = InflateMap::LookupInflatedPromiseInfo<Js::JavascriptPromiseCapability>
                     (inflator,capabilityInfo->CapabilityId);
  return pJVar2;
}

Assistant:

Js::JavascriptPromiseCapability* InflatePromiseCapabilityInfo(const SnapPromiseCapabilityInfo* capabilityInfo, Js::ScriptContext* ctx, InflateMap* inflator)
        {
            if(!inflator->IsPromiseInfoDefined<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId))
            {
                Js::Var promise = inflator->InflateTTDVar(capabilityInfo->PromiseVar);
                Js::Var resolve = inflator->InflateTTDVar(capabilityInfo->ResolveVar);
                Js::Var reject = inflator->InflateTTDVar(capabilityInfo->RejectVar);

                Js::JavascriptPromiseCapability* res = ctx->GetLibrary()->CreatePromiseCapability_TTD(promise, resolve, reject);
                inflator->AddInflatedPromiseInfo<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId, res);
            }

            return inflator->LookupInflatedPromiseInfo<Js::JavascriptPromiseCapability>(capabilityInfo->CapabilityId);
        }